

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_set_str_value_test(btree_kv_ops *kv_ops)

{
  long in_RDI;
  btree *tree;
  uint64_t v_src;
  uint64_t v_dst;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined1 uStack_a8;
  undefined1 local_a7;
  undefined1 *local_70;
  long local_68;
  long local_60 [5];
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  memleak_start();
  local_68 = 100;
  local_a7 = 8;
  local_70 = &uStack_a8;
  (**(code **)(local_8 + 0x48))(&uStack_a8,&local_68,local_60);
  if (local_68 != local_60[0]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1c6);
    kv_set_str_value_test::__test_pass = 0;
    if (local_68 != local_60[0]) {
      __assert_fail("v_src == v_dst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x1c6,"void kv_set_str_value_test(btree_kv_ops *)");
    }
  }
  local_60[0] = 200;
  (**(code **)(local_8 + 0x48))(local_70,local_60,&local_68);
  if (local_68 != local_60[0]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1cb);
    kv_set_str_value_test::__test_pass = 0;
    if (local_68 != local_60[0]) {
      __assert_fail("v_src == v_dst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x1cb,"void kv_set_str_value_test(btree_kv_ops *)");
    }
  }
  memleak_end();
  if (kv_set_str_value_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_set_str_value_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_set_str_value_test");
  }
  return;
}

Assistant:

void kv_set_str_value_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    uint64_t v_dst, v_src = 100;
    btree *tree = alca(struct btree, 1);
    tree->vsize = sizeof(v_dst);

    // set dst value
    kv_ops->set_value(tree,(void *)&v_src,(void *)&v_dst);

    // verify
    TEST_CHK(v_src == v_dst);

    // update dest and copy back to source
    v_dst = 200;
    kv_ops->set_value(tree,(void *)&v_dst,(void *)&v_src);
    TEST_CHK(v_src == v_dst);

    memleak_end();
    TEST_RESULT("kv_set_str_value_test");
}